

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O2

bool __thiscall
QSharedMemorySystemV::create(QSharedMemorySystemV *this,QSharedMemoryPrivate *self,qsizetype size)

{
  bool bVar1;
  int iVar2;
  key_t kVar3;
  int iVar4;
  int *piVar5;
  char *__name;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1String local_68;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  updateNativeKeyFile(this,&self->nativeKey);
  iVar2 = QtIpcCommon::createUnixKeyFile(&this->nativeKeyFile);
  if (iVar2 == -1) {
    QSharedMemory::tr((QString *)&local_58,"%1: unable to make key",(char *)0x0,-1);
    local_68.m_size = 0x16;
    local_68.m_data = "QSharedMemory::handle:";
    QString::arg<QLatin1String,_true>
              ((QString *)&local_40,(QString *)&local_58,&local_68,0,(QChar)0x20);
    self->error = KeyError;
    QString::operator=(&self->errorString,(QString *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else {
    kVar3 = handle(this,self);
    if (kVar3 == 0) {
      if (iVar2 == 1) {
LAB_0043bdf2:
        __name = (this->nativeKeyFile).d.ptr;
        if (__name == (char *)0x0) {
          __name = &QByteArray::_empty;
        }
        unlink(__name);
      }
    }
    else {
      iVar4 = shmget(this->unix_key,size,0x780);
      bVar1 = true;
      if (iVar4 != -1) goto LAB_0043be09;
      piVar5 = __errno_location();
      if (*piVar5 == 0x16) {
        QSharedMemory::tr((QString *)&local_58,"%1: system-imposed size restrictions",(char *)0x0,-1
                         );
        local_68.m_size = 0x15;
        local_68.m_data = "QSharedMemory::handle";
        QString::arg<QLatin1String,_true>
                  ((QString *)&local_40,(QString *)&local_58,&local_68,0,(QChar)0x20);
        self->error = InvalidSize;
        QString::operator=(&self->errorString,(QString *)&local_40);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      else {
        function.m_data = "QSharedMemory::create";
        function.m_size = 0x15;
        QSharedMemoryPrivate::setUnixErrorString(self,function);
      }
      if ((iVar2 == 1) && (self->error != AlreadyExists)) goto LAB_0043bdf2;
    }
  }
  bVar1 = false;
LAB_0043be09:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QSharedMemorySystemV::create(QSharedMemoryPrivate *self, qsizetype size)
{
    // build file if needed
    bool createdFile = false;
    updateNativeKeyFile(self->nativeKey);
    int built = createUnixKeyFile(nativeKeyFile);
    if (built == -1) {
        self->setError(QSharedMemory::KeyError,
                       QSharedMemory::tr("%1: unable to make key")
                       .arg("QSharedMemory::handle:"_L1));
        return false;
    }
    if (built == 1) {
        createdFile = true;
    }

    // get handle
    if (!handle(self)) {
        if (createdFile)
            unlink(nativeKeyFile);
        return false;
    }

    // create
    if (-1 == shmget(unix_key, size_t(size), 0600 | IPC_CREAT | IPC_EXCL)) {
        const auto function = "QSharedMemory::create"_L1;
        switch (errno) {
        case EINVAL:
            self->setError(QSharedMemory::InvalidSize,
                           QSharedMemory::tr("%1: system-imposed size restrictions")
                           .arg("QSharedMemory::handle"_L1));
            break;
        default:
            self->setUnixErrorString(function);
        }
        if (createdFile && self->error != QSharedMemory::AlreadyExists)
            unlink(nativeKeyFile);
        return false;
    }

    return true;
}